

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::getRelativeJacobianSparsityPattern
          (KinDynComputations *this,FrameIndex refFrameIndex,FrameIndex frameIndex,
          MatrixView<double> *outJacobian)

{
  undefined8 *puVar1;
  MatrixStorageOrdering MVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char cVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long *plVar10;
  ulong uVar11;
  double *pdVar12;
  char *pcVar13;
  double *pdVar14;
  long lVar15;
  char *pcVar16;
  pointer peVar17;
  index_type iVar18;
  pointer peVar19;
  ulong uVar20;
  Index i;
  long lVar21;
  long lVar22;
  ulong uVar23;
  PointerType ptr;
  long lVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ulong uVar29;
  int iVar30;
  SpatialMotionVector column;
  type tmp;
  Matrix6x6 genericAdjointTransform;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double local_1a0 [3];
  element_type aeStack_188 [7];
  double local_150 [36];
  
  if ((outJacobian->m_rows == 6) &&
     (lVar9 = outJacobian->m_cols, lVar8 = iDynTree::Model::getNrOfDOFs(), lVar9 == lVar8)) {
    cVar5 = iDynTree::Model::isValidFrameIndex((long)&this->pimpl->m_robot_model);
    if (cVar5 == '\0') {
      pcVar16 = "getRelativeJacobian";
      pcVar13 = "Frame index out of bounds";
    }
    else {
      cVar5 = iDynTree::Model::isValidFrameIndex((long)&this->pimpl->m_robot_model);
      auVar4 = _DAT_00116010;
      auVar3 = _DAT_00116000;
      if (cVar5 != '\0') {
        bVar25 = outJacobian->m_storageOrder == ColumnMajor;
        lVar9 = outJacobian->m_cols;
        lVar8 = outJacobian->m_rows;
        lVar24 = 1;
        if (bVar25) {
          lVar24 = lVar8;
        }
        lVar15 = 1;
        if (!bVar25) {
          lVar15 = lVar9;
        }
        if (0 < lVar8) {
          peVar17 = outJacobian->m_storage;
          lVar21 = lVar9 + -1;
          auVar26._8_4_ = (int)lVar21;
          auVar26._0_8_ = lVar21;
          auVar26._12_4_ = (int)((ulong)lVar21 >> 0x20);
          lVar21 = 0;
          auVar26 = auVar26 ^ _DAT_00116010;
          do {
            uVar23 = lVar9 + 1U & 0xfffffffffffffffe;
            peVar19 = peVar17;
            auVar27 = auVar3;
            if (0 < lVar9) {
              do {
                bVar25 = auVar26._0_4_ < SUB164(auVar27 ^ auVar4,0);
                iVar6 = auVar26._4_4_;
                iVar30 = SUB164(auVar27 ^ auVar4,4);
                if ((bool)(~(iVar6 < iVar30 || iVar30 == iVar6 && bVar25) & 1)) {
                  *peVar19 = 0.0;
                }
                if (iVar6 >= iVar30 && (iVar30 != iVar6 || !bVar25)) {
                  peVar19[lVar24] = 0.0;
                }
                auVar28._0_8_ = auVar27._0_8_ + 2;
                auVar28._8_8_ = auVar27._8_8_ + 2;
                uVar23 = uVar23 - 2;
                peVar19 = peVar19 + lVar24 * 2;
                auVar27 = auVar28;
              } while (uVar23 != 0);
            }
            lVar21 = lVar21 + 1;
            peVar17 = peVar17 + lVar15;
          } while (lVar21 != lVar8);
        }
        lVar9 = iDynTree::Model::getFrameLink((long)&this->pimpl->m_robot_model);
        iDynTree::Model::getFrameLink((long)&this->pimpl->m_robot_model);
        lVar8 = iDynTree::LinkTraversalsCache::getTraversalWithLinkAsBase
                          ((Model *)&this->pimpl->m_traversalCache,(long)&this->pimpl->m_robot_model
                          );
        lVar24 = 0;
        memset(local_150,0,0x120);
        do {
          *(undefined8 *)((long)local_150 + lVar24) = 0x3ff0000000000000;
          *(undefined8 *)((long)local_150 + lVar24 + 8) = 0x3ff0000000000000;
          *(undefined8 *)((long)local_150 + lVar24 + 0x10) = 0x3ff0000000000000;
          lVar24 = lVar24 + 0x30;
        } while (lVar24 != 0x90);
        uVar23 = (ulong)((uint)((ulong)(local_150 + 3) >> 3) & 1);
        lVar24 = uVar23 * 8;
        lVar15 = 0;
        do {
          if (uVar23 == 0) {
            puVar1 = (undefined8 *)((long)local_150 + lVar15 + lVar24 + 0x18);
            *puVar1 = 0x3ff0000000000000;
            puVar1[1] = 0x3ff0000000000000;
            *(undefined8 *)((long)local_150 + lVar15 + lVar24 + 0x28) = 0x3ff0000000000000;
          }
          else {
            *(undefined8 *)((long)local_150 + lVar15 + 0x18) = 0x3ff0000000000000;
            puVar1 = (undefined8 *)((long)local_150 + lVar15 + lVar24 + 0x18);
            *puVar1 = 0x3ff0000000000000;
            puVar1[1] = 0x3ff0000000000000;
          }
          lVar15 = lVar15 + 0x30;
        } while (lVar15 != 0x90);
        lVar24 = 0xa8;
        do {
          *(undefined8 *)((long)local_150 + lVar24) = 0x3ff0000000000000;
          *(undefined8 *)((long)local_150 + lVar24 + 8) = 0x3ff0000000000000;
          *(undefined8 *)((long)local_150 + lVar24 + 0x10) = 0x3ff0000000000000;
          lVar24 = lVar24 + 0x30;
        } while (lVar24 != 0x138);
        iDynTree::Traversal::getBaseLink();
        lVar24 = iDynTree::Link::getIndex();
        if (lVar9 != lVar24) {
          do {
            iDynTree::Traversal::getParentLinkFromLinkIndex(lVar8);
            lVar24 = iDynTree::Link::getIndex();
            plVar10 = (long *)iDynTree::Traversal::getParentJointFromLinkIndex(lVar8);
            lVar15 = (**(code **)(*plVar10 + 0xc0))(plVar10);
            iVar6 = (**(code **)(*plVar10 + 0x20))(plVar10);
            if (iVar6 != 0) {
              lVar21 = lVar15 * 8;
              uVar23 = 0;
              do {
                pdVar14 = &local_1b8;
                (**(code **)(*plVar10 + 0x60))(pdVar14,plVar10,uVar23 & 0xffffffff,lVar9,lVar24);
                uVar11 = 0;
                uVar29 = (ulong)DAT_00116040;
                do {
                  pdVar12 = local_1a0 + ((int)uVar11 - 3);
                  if (uVar11 < 3) {
                    pdVar12 = pdVar14;
                  }
                  *pdVar12 = (double)(~-(ulong)((double)((ulong)*pdVar12 & uVar29) < DEFAULT_TOL) &
                                     0x3ff0000000000000);
                  uVar11 = uVar11 + 1;
                  pdVar14 = pdVar14 + 1;
                } while (uVar11 != 6);
                MVar2 = outJacobian->m_storageOrder;
                iVar18 = outJacobian->m_cols;
                peVar17 = outJacobian->m_storage;
                uVar11 = outJacobian->m_rows;
                uVar20 = 1;
                if (MVar2 == ColumnMajor) {
                  uVar20 = uVar11;
                }
                pdVar14 = local_150 + 4;
                lVar22 = 0;
                do {
                  local_1a0[lVar22 + 3] =
                       pdVar14[1] * local_1a0[2] + pdVar14[-1] * local_1a0[0] +
                       pdVar14[-3] * dStack_1b0 +
                       *pdVar14 * local_1a0[1] + pdVar14[-2] * local_1a8 + pdVar14[-4] * local_1b8;
                  lVar22 = lVar22 + 1;
                  pdVar14 = pdVar14 + 6;
                } while (lVar22 != 6);
                if (MVar2 == ColumnMajor) {
                  iVar18 = 1;
                }
                if (0 < (long)uVar11) {
                  peVar19 = (pointer)(uVar20 * lVar21 + (long)peVar17);
                  uVar20 = 0;
                  do {
                    *peVar19 = local_1a0[uVar20 + 3];
                    uVar20 = uVar20 + 1;
                    peVar19 = peVar19 + iVar18;
                  } while (uVar11 != uVar20);
                  uVar11 = outJacobian->m_rows;
                }
                if (uVar11 != 0) {
                  uVar20 = 0;
                  do {
                    iVar18 = 1;
                    if (MVar2 != ColumnMajor) {
                      iVar18 = outJacobian->m_cols;
                      uVar11 = 1;
                    }
                    lVar22 = uVar11 * (lVar15 + uVar23);
                    peVar17[lVar22 + iVar18 * uVar20] =
                         (element_type)
                         (~-(ulong)((double)((ulong)peVar17[lVar22 + iVar18 * uVar20] & uVar29) <
                                   DEFAULT_TOL) & 0x3ff0000000000000);
                    uVar20 = uVar20 + 1;
                    uVar11 = outJacobian->m_rows;
                  } while (uVar20 < uVar11);
                }
                uVar23 = uVar23 + 1;
                uVar7 = (**(code **)(*plVar10 + 0x20))(plVar10);
                lVar21 = lVar21 + 8;
              } while (uVar23 < uVar7);
            }
            iDynTree::Traversal::getBaseLink();
            lVar15 = iDynTree::Link::getIndex();
            lVar9 = lVar24;
          } while (lVar24 != lVar15);
        }
        return true;
      }
      pcVar16 = "getRelativeJacobian";
      pcVar13 = "Reference frame index out of bounds";
    }
  }
  else {
    pcVar16 = "getRelativeJacobianSparsityPattern";
    pcVar13 = "Wrong size in input outJacobian";
  }
  iDynTree::reportError("KinDynComputations",pcVar16,pcVar13);
  return false;
}

Assistant:

bool KinDynComputations::getRelativeJacobianSparsityPattern(const iDynTree::FrameIndex refFrameIndex,
                                                            const iDynTree::FrameIndex frameIndex,
                                                            MatrixView<double> outJacobian) const
    {
        bool ok = (outJacobian.rows() == 6)
            && (outJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs());

        if( !ok )
        {
            reportError("KinDynComputations","getRelativeJacobianSparsityPattern","Wrong size in input outJacobian");
            return false;
        }

        if (!pimpl->m_robot_model.isValidFrameIndex(frameIndex))
        {
            reportError("KinDynComputations","getRelativeJacobian","Frame index out of bounds");
            return false;
        }
        if (!pimpl->m_robot_model.isValidFrameIndex(refFrameIndex))
        {
            reportError("KinDynComputations","getRelativeJacobian","Reference frame index out of bounds");
            return false;
        }

        // clear the matrix
        toEigen(outJacobian).setZero();

        // This method computes the sparsity pattern of the relative Jacobian.
        // For details on how to compute the relative Jacobian, see Traversaro's PhD thesis, 3.37
        // or getRelativeJacobianExplicit method.
        // Here we simply implement the same code, but trying to obtain only 1 and zeros.

        // Get the links to which the frames are attached
        LinkIndex jacobianLinkIndex = pimpl->m_robot_model.getFrameLink(frameIndex);
        LinkIndex refJacobianLink = pimpl->m_robot_model.getFrameLink(refFrameIndex);

        iDynTree::Traversal& relativeTraversal = pimpl->m_traversalCache.getTraversalWithLinkAsBase(pimpl->m_robot_model, refJacobianLink);

        // Compute joint part
        // We iterate from the link up in the traveral until we reach the base
        LinkIndex visitedLinkIdx = jacobianLinkIndex;

        // Generic adjoint transform matrix (6x6).
        // Rotations are filled with 1.
        Matrix6x6 genericAdjointTransform;
        genericAdjointTransform.zero();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).topLeftCorner(3, 3).setOnes();
        // Set 1 to p \times R (top right)
        iDynTree::toEigen(genericAdjointTransform).topRightCorner(3, 3).setOnes();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).bottomRightCorner(3, 3).setOnes();


        while (visitedLinkIdx != relativeTraversal.getBaseLink()->getIndex())
        {
            //get the pair of links in the traversal
            LinkIndex parentLinkIdx = relativeTraversal.getParentLinkFromLinkIndex(visitedLinkIdx)->getIndex();
            IJointConstPtr joint = relativeTraversal.getParentJointFromLinkIndex(visitedLinkIdx);

            //Now for each Dof get the motion subspace
            //{}^F s_{E,F}, i.e. the velocity of F wrt E written in F.
            size_t dofOffset = joint->getDOFsOffset();
            for (int i = 0; i < joint->getNrOfDOFs(); ++i)
            {
                // This is actually where we specify the pattern
                SpatialMotionVector column = joint->getMotionSubspaceVector(i, visitedLinkIdx, parentLinkIdx);
                for (size_t c = 0; c < column.size(); ++c) {
                    column(c) = std::abs(column(c)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }
                toEigen(outJacobian).col(dofOffset + i) = toEigen(genericAdjointTransform) * toEigen(column);
                //have only 0 and 1 => divide component wise the column by itself
                for (size_t r = 0; r < toEigen(outJacobian).col(dofOffset + i).size(); ++r) {
                    toEigen(outJacobian).col(dofOffset + i).coeffRef(r) = std::abs(toEigen(outJacobian).col(dofOffset + i).coeffRef(r)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }

            }

            visitedLinkIdx = parentLinkIdx;
        }
        return true;
    }